

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIListBox.cpp
# Opt level: O3

bool __thiscall
irr::gui::CGUIListBox::getSerializationLabels
          (CGUIListBox *this,EGUI_LISTBOX_COLOR colorType,stringc *useColorLabel,stringc *colorLabel
          )

{
  int iVar1;
  
  if (colorType < EGUI_LBC_COUNT) {
    iVar1 = *(int *)(&DAT_00237648 + (ulong)colorType * 4);
    core::string<char>::operator=
              (useColorLabel,&DAT_00237638 + *(int *)(&DAT_00237638 + (ulong)colorType * 4));
    core::string<char>::operator=(colorLabel,&DAT_00237648 + iVar1);
  }
  return colorType < EGUI_LBC_COUNT;
}

Assistant:

bool CGUIListBox::getSerializationLabels(EGUI_LISTBOX_COLOR colorType, core::stringc &useColorLabel, core::stringc &colorLabel) const
{
	switch (colorType) {
	case EGUI_LBC_TEXT:
		useColorLabel = "UseColText";
		colorLabel = "ColText";
		break;
	case EGUI_LBC_TEXT_HIGHLIGHT:
		useColorLabel = "UseColTextHl";
		colorLabel = "ColTextHl";
		break;
	case EGUI_LBC_ICON:
		useColorLabel = "UseColIcon";
		colorLabel = "ColIcon";
		break;
	case EGUI_LBC_ICON_HIGHLIGHT:
		useColorLabel = "UseColIconHl";
		colorLabel = "ColIconHl";
		break;
	default:
		return false;
	}
	return true;
}